

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void close_func(LexState *ls)

{
  int iVar1;
  FuncState *fs;
  lua_State *L;
  Proto *pPVar2;
  Instruction *pIVar3;
  int *piVar4;
  TValue *pTVar5;
  Proto **ppPVar6;
  LocVar *pLVar7;
  Upvaldesc *pUVar8;
  
  fs = ls->fs;
  L = ls->L;
  pPVar2 = fs->f;
  luaK_ret(fs,0,0);
  leaveblock(fs);
  pIVar3 = (Instruction *)
           luaM_realloc_(L,pPVar2->code,(long)pPVar2->sizecode << 2,(long)fs->pc << 2);
  pPVar2->code = pIVar3;
  iVar1 = fs->pc;
  pPVar2->sizecode = iVar1;
  piVar4 = (int *)luaM_realloc_(L,pPVar2->lineinfo,(long)pPVar2->sizelineinfo << 2,(long)iVar1 << 2)
  ;
  pPVar2->lineinfo = piVar4;
  pPVar2->sizelineinfo = fs->pc;
  pTVar5 = (TValue *)luaM_realloc_(L,pPVar2->k,(long)pPVar2->sizek << 4,(long)fs->nk << 4);
  pPVar2->k = pTVar5;
  pPVar2->sizek = fs->nk;
  ppPVar6 = (Proto **)luaM_realloc_(L,pPVar2->p,(long)pPVar2->sizep << 3,(long)fs->np << 3);
  pPVar2->p = ppPVar6;
  pPVar2->sizep = fs->np;
  pLVar7 = (LocVar *)
           luaM_realloc_(L,pPVar2->locvars,(long)pPVar2->sizelocvars << 5,(long)fs->nlocvars << 5);
  pPVar2->locvars = pLVar7;
  pPVar2->sizelocvars = (int)fs->nlocvars;
  pUVar8 = (Upvaldesc *)
           luaM_realloc_(L,pPVar2->upvalues,(long)pPVar2->sizeupvalues * 0x18,(ulong)fs->nups * 0x18
                        );
  pPVar2->upvalues = pUVar8;
  pPVar2->sizeupvalues = (uint)fs->nups;
  if (fs->bl != (BlockCnt *)0x0) {
    __assert_fail("fs->bl == ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                  ,0x409,"void close_func(LexState *)");
  }
  ls->fs = fs->prev;
  if (0 < L->l_G->GCdebt) {
    luaC_step(L);
    return;
  }
  return;
}

Assistant:

static void close_func (LexState *ls) {
  lua_State *L = ls->L;
  FuncState *fs = ls->fs;
  Proto *f = fs->f;
  luaK_ret(fs, 0, 0);  /* final return */
  leaveblock(fs);
  luaM_reallocvector(L, f->code, f->sizecode, fs->pc, Instruction);
  f->sizecode = fs->pc;
  luaM_reallocvector(L, f->lineinfo, f->sizelineinfo, fs->pc, int);
  f->sizelineinfo = fs->pc;
  luaM_reallocvector(L, f->k, f->sizek, fs->nk, TValue);
  f->sizek = fs->nk;
  luaM_reallocvector(L, f->p, f->sizep, fs->np, Proto *);
  f->sizep = fs->np;
  luaM_reallocvector(L, f->locvars, f->sizelocvars, fs->nlocvars, LocVar);
  f->sizelocvars = fs->nlocvars;
  luaM_reallocvector(L, f->upvalues, f->sizeupvalues, fs->nups, Upvaldesc);
  f->sizeupvalues = fs->nups;
  lua_assert(fs->bl == NULL);
  ls->fs = fs->prev;
  luaC_checkGC(L);
}